

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emr_test.cc
# Opt level: O0

int test_list_jobs(void)

{
  code *pcVar1;
  char *__s;
  EmrListJobsRequestType *pEVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_171;
  int ret;
  HttpTestListener *local_150;
  HttpTestListener *listener;
  string local_140;
  allocator<char> local_119;
  string local_118 [39];
  allocator<char> local_f1;
  string local_f0 [55];
  allocator<char> local_b9;
  string local_b8 [32];
  EmrListJobsRequestType *local_98;
  Emr *emr;
  EmrListJobsResponseType resp;
  EmrListJobsRequestType req;
  
  aliyun::EmrListJobsRequestType::EmrListJobsRequestType((EmrListJobsRequestType *)&resp.page_size);
  aliyun::EmrListJobsResponseType::EmrListJobsResponseType((EmrListJobsResponseType *)&emr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"cn-hangzhou",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"my_appid",&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_118,"my_secret",&local_119);
  pEVar2 = (EmrListJobsRequestType *)aliyun::Emr::CreateEmrClient(local_b8,local_f0,local_118);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  local_98 = pEVar2;
  if (pEVar2 == (EmrListJobsRequestType *)0x0) {
    aliyun::EmrListJobsResponseType::~EmrListJobsResponseType((EmrListJobsResponseType *)&emr);
    aliyun::EmrListJobsRequestType::~EmrListJobsRequestType
              ((EmrListJobsRequestType *)&resp.page_size);
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Emr::SetProxyHost((Emr *)pEVar2,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Emr::SetUseTls((Emr *)local_98,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_list_jobs_response;
  local_150 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_171);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_171);
  HttpTestListener::Start(local_150);
  std::__cxx11::string::operator=((string *)&resp.page_size,"IsDesc");
  std::__cxx11::string::operator=((string *)(req.is_desc.field_2._M_local_buf + 8),"PageNumber");
  std::__cxx11::string::operator=((string *)(req.page_number.field_2._M_local_buf + 8),"PageSize");
  aliyun::Emr::ListJobs(local_98,(EmrListJobsResponseType *)&resp.page_size,(EmrErrorInfo *)&emr);
  HttpTestListener::WaitComplete(local_150);
  pHVar3 = local_150;
  if (local_150 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_150);
    operator_delete(pHVar3,0x180);
  }
  pEVar2 = local_98;
  if (local_98 != (EmrListJobsRequestType *)0x0) {
    aliyun::Emr::~Emr((Emr *)local_98);
    operator_delete(pEVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_list_jobs() {
  EmrListJobsRequestType req;
  EmrListJobsResponseType resp;
  Emr* emr = Emr::CreateEmrClient("cn-hangzhou", "my_appid", "my_secret");
  if(!emr) return 0;
  emr->SetProxyHost("127.0.0.1:12234");
  emr->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_list_jobs_response);
  listener->Start();
  req.is_desc = "IsDesc";
  req.page_number = "PageNumber";
  req.page_size = "PageSize";
  int ret = emr->ListJobs(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete emr;
}